

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::NFFImporter::LoadNFF2MaterialTable
          (NFFImporter *this,
          vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
          *output,string *path,IOSystem *pIOHandler)

{
  char *pcVar1;
  byte bVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  pointer pcVar5;
  byte bVar6;
  int iVar7;
  undefined4 extraout_var;
  Logger *pLVar8;
  long *plVar9;
  ostream *poVar10;
  byte *pbVar11;
  long *plVar12;
  long lVar13;
  byte *pbVar14;
  long lVar15;
  char *sz;
  vector<char,_std::allocator<char>_> mBuffer2;
  char line [4096];
  byte *local_1238;
  IOStream *local_1230;
  pointer local_1228;
  allocator<char> local_1219;
  long *local_1218;
  long local_1208 [2];
  vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
  *local_11f8;
  vector<char,_std::allocator<char>_> local_11f0;
  long *local_11d8;
  long local_11d0;
  long local_11c8 [2];
  undefined1 local_11b8 [32];
  ai_real local_1198;
  undefined1 local_1194 [16];
  undefined8 local_1184;
  float local_117c;
  _Alloc_hider local_1178;
  size_type local_1170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1168;
  undefined2 local_1158;
  undefined8 local_1154;
  _Alloc_hider local_1148;
  size_type local_1140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1138;
  aiTextureMapping local_1128;
  undefined1 local_1038 [4104];
  IOStream *stream;
  
  pcVar1 = local_1038 + 0x10;
  local_1038._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"rb","");
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(path->_M_dataplus)._M_p,local_1038._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar7);
  if ((char *)local_1038._0_8_ != pcVar1) {
    operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
  }
  if (stream == (IOStream *)0x0) {
    pLVar8 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11b8,
                   "NFF2: Unable to open material library ",path);
    plVar9 = (long *)std::__cxx11::string::append(local_11b8);
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_1038._16_8_ = *plVar12;
      local_1038._24_8_ = plVar9[3];
      local_1038._0_8_ = pcVar1;
    }
    else {
      local_1038._16_8_ = *plVar12;
      local_1038._0_8_ = (long *)*plVar9;
    }
    local_1038._8_8_ = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    Logger::error(pLVar8,(char *)local_1038._0_8_);
    if ((char *)local_1038._0_8_ != pcVar1) {
      operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
    }
    if ((undefined1 *)local_11b8._0_8_ == local_11b8 + 0x10) {
      return;
    }
    operator_delete((void *)local_11b8._0_8_,local_11b8._16_8_ + 1);
    return;
  }
  iVar7 = (*stream->_vptr_IOStream[6])(stream);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_11f0,(ulong)(iVar7 + 1),(allocator_type *)local_1038);
  BaseImporter::TextFileToBuffer(stream,&local_11f0,FORBID_EMPTY);
  pcVar5 = local_11f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  CommentRemover::RemoveLineComments
            ("//",local_11f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,' ');
  iVar7 = (byte)*pcVar5 - 0x6d;
  if ((iVar7 == 0) && (iVar7 = (byte)pcVar5[1] - 0x61, iVar7 == 0)) {
    iVar7 = 0x74 - (uint)(byte)pcVar5[2];
  }
  else {
    iVar7 = -iVar7;
  }
  if (iVar7 == 0) {
    bVar6 = pcVar5[3];
    if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
      pbVar14 = (byte *)(pcVar5 + 4);
      if (bVar6 == 0) {
        pbVar14 = (byte *)(pcVar5 + 3);
      }
      bVar6 = pcVar5[4 - (ulong)(bVar6 == 0)];
      local_1230 = stream;
      local_11f8 = output;
      if (bVar6 != 0) {
        local_1228 = (pointer)0x0;
        do {
          lVar15 = 0;
          while( true ) {
            for (; ((0xd < bVar6 || ((0x3401U >> (bVar6 & 0x1f) & 1) == 0)) && (lVar15 != 0x1000));
                lVar15 = lVar15 + 1) {
              local_1038[lVar15] = bVar6;
              bVar6 = pbVar14[1];
              pbVar14 = pbVar14 + 1;
            }
            local_1038[lVar15] = 0;
            while ((*pbVar14 < 0xe && ((0x3400U >> (*pbVar14 & 0x1f) & 1) != 0))) {
              pbVar14 = pbVar14 + 1;
            }
            for (lVar15 = 0; (bVar6 = local_1038[lVar15], bVar6 == 0x20 || (bVar6 == 9));
                lVar15 = lVar15 + 1) {
            }
            pbVar11 = local_1038 + lVar15;
            local_1238 = pbVar11;
            iVar7 = strncmp("version",(char *)pbVar11,7);
            if (iVar7 == 0) {
              bVar2 = local_1038[lVar15 + 7];
              if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
                local_1238 = local_1038 + (lVar15 - (ulong)(bVar2 == 0)) + 8;
                pLVar8 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[44]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_11b8,(char (*) [44])"NFF (Sense8) material library file format: ");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_11d8,(char *)local_1238,&local_1219);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_11b8,(char *)local_11d8,local_11d0);
                std::__cxx11::stringbuf::str();
                Logger::info(pLVar8,(char *)local_1218);
                if (local_1218 != local_1208) {
                  operator_delete(local_1218,local_1208[0] + 1);
                }
                if (local_11d8 != local_11c8) {
                  operator_delete(local_11d8,local_11c8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11b8);
                std::ios_base::~ios_base((ios_base *)&local_1148);
                goto LAB_004884fb;
              }
            }
            iVar7 = strncmp("matdef",(char *)pbVar11,6);
            if (iVar7 == 0) {
              bVar2 = local_1038[lVar15 + 6];
              if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
                local_1238 = local_1038 + (lVar15 - (ulong)(bVar2 == 0)) + 7;
                local_11b8._0_8_ = (char *)0x3f19999a3f19999a;
                local_11b8._8_8_ = 0x3f8000003f19999a;
                local_11b8._16_8_ = 0x3f8000003f800000;
                local_11b8._24_8_ = 0x3f8000003f800000;
                local_1198 = 1.0;
                local_1184._0_4_ = 0.0;
                local_1184._4_4_ = 0.0;
                local_1194._0_4_ = 0.0;
                local_1194._4_4_ = 0.0;
                local_1194._8_4_ = 0.0;
                local_1194._12_4_ = 0.0;
                local_117c = 1.0;
                local_1178._M_p = (pointer)&local_1168;
                local_1170 = 0;
                local_1168._M_local_buf[0] = '\0';
                local_1158._0_1_ = false;
                local_1158._1_1_ = true;
                local_1154._0_4_ = 1.0;
                local_1154._4_4_ = 0.0;
                local_1140 = 0;
                local_1138._M_local_buf[0] = '\0';
                local_1128 = aiTextureMapping_UV;
                local_1148._M_p = (pointer)&local_1138;
                std::
                vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
                ::emplace_back<Assimp::NFFImporter::ShadingInfo>
                          (local_11f8,(ShadingInfo *)local_11b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1148._M_p != &local_1138) {
                  operator_delete(local_1148._M_p,
                                  CONCAT71(local_1138._M_allocated_capacity._1_7_,
                                           local_1138._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1178._M_p != &local_1168) {
                  operator_delete(local_1178._M_p,
                                  CONCAT71(local_1168._M_allocated_capacity._1_7_,
                                           local_1168._M_local_buf[0]) + 1);
                }
                local_1228 = (local_11f8->
                             super__Vector_base<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish + -1;
                goto LAB_004884fb;
              }
            }
            iVar7 = strncmp("valid",(char *)pbVar11,5);
            if (iVar7 == 0) {
              bVar2 = local_1038[lVar15 + 5];
              if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
                local_1238 = local_1038 + (lVar15 - (ulong)(bVar2 == 0)) + 6;
                goto LAB_004884fb;
              }
            }
            if ((0xd < bVar6) || ((0x3401U >> (bVar6 & 0x1f) & 1) == 0)) break;
            bVar6 = *pbVar14;
            lVar15 = 0;
            stream = local_1230;
            if (bVar6 == 0) goto LAB_00488cd6;
          }
          if (local_1228 == (pointer)0x0) {
            pLVar8 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[38]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_11b8,(char (*) [38])"NFF2 material library: Found element ");
            poVar10 = (ostream *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_11b8,(char **)&local_1238);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"but there is no active material",0x1f);
            std::__cxx11::stringbuf::str();
            Logger::error(pLVar8,(char *)local_1218);
            if (local_1218 != local_1208) {
              operator_delete(local_1218,local_1208[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11b8);
            std::ios_base::~ios_base((ios_base *)&local_1148);
            local_1228 = (pointer)0x0;
          }
          else {
            local_11b8._0_8_ = (char *)0x0;
            local_11b8._8_8_ = local_11b8._8_8_ & 0xffffffff00000000;
            iVar7 = strncmp("ambient",(char *)pbVar11,7);
            if (iVar7 == 0) {
              bVar6 = local_1038[lVar15 + 7];
              if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
                puVar3 = local_1038 + 8;
                if (bVar6 == 0) {
                  puVar3 = local_1038 + 7;
                }
                for (pbVar11 = puVar3 + lVar15; (*pbVar11 == 0x20 || (*pbVar11 == 9));
                    pbVar11 = pbVar11 + 1) {
                }
                if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                  local_1238 = pbVar11;
                  pbVar11 = (byte *)fast_atoreal_move<float>
                                              ((char *)pbVar11,(float *)local_11b8,true);
                }
                for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
                }
                if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                  local_1238 = pbVar11;
                  pbVar11 = (byte *)fast_atoreal_move<float>
                                              ((char *)pbVar11,(float *)(local_11b8 + 4),true);
                }
                for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
                }
                local_1238 = pbVar11;
                if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                  local_1238 = (byte *)fast_atoreal_move<float>
                                                 ((char *)pbVar11,(float *)(local_11b8 + 8),true);
                }
                (local_1228->ambient).r = (ai_real)local_11b8._0_4_;
                (local_1228->ambient).g = (ai_real)local_11b8._4_4_;
                (local_1228->ambient).b = (ai_real)local_11b8._8_4_;
                goto LAB_004884fb;
              }
            }
            iVar7 = strncmp("diffuse",(char *)pbVar11,7);
            if (iVar7 == 0) {
              bVar6 = local_1038[lVar15 + 7];
              if ((0x20 < (ulong)bVar6) || ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) == 0))
              goto LAB_00488567;
              puVar3 = local_1038 + 7;
              lVar13 = 8;
LAB_00488871:
              puVar4 = local_1038 + lVar13;
              if (bVar6 == 0) {
                puVar4 = puVar3;
              }
              for (pbVar11 = puVar4 + lVar15; (*pbVar11 == 0x20 || (*pbVar11 == 9));
                  pbVar11 = pbVar11 + 1) {
              }
              if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                local_1238 = pbVar11;
                pbVar11 = (byte *)fast_atoreal_move<float>((char *)pbVar11,(float *)local_11b8,true)
                ;
              }
              for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
              }
              if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                local_1238 = pbVar11;
                pbVar11 = (byte *)fast_atoreal_move<float>
                                            ((char *)pbVar11,(float *)(local_11b8 + 4),true);
              }
              for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
              }
              local_1238 = pbVar11;
              if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                local_1238 = (byte *)fast_atoreal_move<float>
                                               ((char *)pbVar11,(float *)(local_11b8 + 8),true);
              }
              (local_1228->ambient).b = (ai_real)local_11b8._8_4_;
              (local_1228->ambient).r = (ai_real)local_11b8._0_4_;
              (local_1228->ambient).g = (ai_real)local_11b8._4_4_;
              (local_1228->diffuse).r = (ai_real)local_11b8._0_4_;
              (local_1228->diffuse).g = (ai_real)local_11b8._4_4_;
              (local_1228->diffuse).b = (ai_real)local_11b8._8_4_;
            }
            else {
LAB_00488567:
              iVar7 = strncmp("ambientdiffuse",(char *)pbVar11,0xe);
              if (iVar7 == 0) {
                bVar6 = local_1038[lVar15 + 0xe];
                if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
                  puVar3 = local_1038 + 0xe;
                  lVar13 = 0xf;
                  goto LAB_00488871;
                }
              }
              iVar7 = strncmp("specular",(char *)pbVar11,8);
              if (iVar7 == 0) {
                bVar6 = local_1038[lVar15 + 8];
                if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
                  puVar3 = local_1038 + 9;
                  if (bVar6 == 0) {
                    puVar3 = local_1038 + 8;
                  }
                  for (pbVar11 = puVar3 + lVar15; (*pbVar11 == 0x20 || (*pbVar11 == 9));
                      pbVar11 = pbVar11 + 1) {
                  }
                  if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                    local_1238 = pbVar11;
                    pbVar11 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar11,(float *)local_11b8,true);
                  }
                  for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
                  }
                  if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                    local_1238 = pbVar11;
                    pbVar11 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar11,(float *)(local_11b8 + 4),true);
                  }
                  for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
                  }
                  local_1238 = pbVar11;
                  if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                    local_1238 = (byte *)fast_atoreal_move<float>
                                                   ((char *)pbVar11,(float *)(local_11b8 + 8),true);
                  }
                  (local_1228->specular).r = (ai_real)local_11b8._0_4_;
                  (local_1228->specular).g = (ai_real)local_11b8._4_4_;
                  (local_1228->specular).b = (ai_real)local_11b8._8_4_;
                  goto LAB_004884fb;
                }
              }
              iVar7 = strncmp("emission",(char *)pbVar11,8);
              if (iVar7 == 0) {
                bVar6 = local_1038[lVar15 + 8];
                if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
                  puVar3 = local_1038 + 9;
                  if (bVar6 == 0) {
                    puVar3 = local_1038 + 8;
                  }
                  for (pbVar11 = puVar3 + lVar15; (*pbVar11 == 0x20 || (*pbVar11 == 9));
                      pbVar11 = pbVar11 + 1) {
                  }
                  if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                    local_1238 = pbVar11;
                    pbVar11 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar11,(float *)local_11b8,true);
                  }
                  for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
                  }
                  if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                    local_1238 = pbVar11;
                    pbVar11 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar11,(float *)(local_11b8 + 4),true);
                  }
                  for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
                  }
                  local_1238 = pbVar11;
                  if ((0xd < *pbVar11) || ((0x3401U >> (*pbVar11 & 0x1f) & 1) == 0)) {
                    local_1238 = (byte *)fast_atoreal_move<float>
                                                   ((char *)pbVar11,(float *)(local_11b8 + 8),true);
                  }
                  (local_1228->emissive).r = (ai_real)local_11b8._0_4_;
                  (local_1228->emissive).g = (ai_real)local_11b8._4_4_;
                  (local_1228->emissive).b = (ai_real)local_11b8._8_4_;
                  goto LAB_004884fb;
                }
              }
              iVar7 = strncmp("shininess",(char *)pbVar11,9);
              if (iVar7 == 0) {
                bVar6 = local_1038[lVar15 + 9];
                if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
                  puVar3 = local_1038 + 10;
                  if (bVar6 == 0) {
                    puVar3 = local_1038 + 9;
                  }
                  for (local_1238 = puVar3 + lVar15; (*local_1238 == 0x20 || (*local_1238 == 9));
                      local_1238 = local_1238 + 1) {
                  }
                  if ((0xd < *local_1238) || ((0x3401U >> (*local_1238 & 0x1f) & 1) == 0)) {
                    local_1238 = (byte *)fast_atoreal_move<float>
                                                   ((char *)local_1238,&local_1228->shininess,true);
                  }
                  goto LAB_004884fb;
                }
              }
              iVar7 = strncmp("opacity",(char *)pbVar11,7);
              if (iVar7 == 0) {
                bVar6 = local_1038[lVar15 + 7];
                if (((ulong)bVar6 < 0x21) && ((0x100003601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
                  puVar3 = local_1038 + 8;
                  if (bVar6 == 0) {
                    puVar3 = local_1038 + 7;
                  }
                  for (local_1238 = puVar3 + lVar15; (*local_1238 == 0x20 || (*local_1238 == 9));
                      local_1238 = local_1238 + 1) {
                  }
                  if ((0xd < *local_1238) || ((0x3401U >> (*local_1238 & 0x1f) & 1) == 0)) {
                    local_1238 = (byte *)fast_atoreal_move<float>
                                                   ((char *)local_1238,&local_1228->opacity,true);
                  }
                }
              }
            }
          }
LAB_004884fb:
          bVar6 = *pbVar14;
          stream = local_1230;
        } while (bVar6 != 0);
      }
      goto LAB_00488cd6;
    }
  }
  pLVar8 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[36]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038,
             (char (*) [36])"NFF2: Not a valid material library ");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1038,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1038,".",1);
  std::__cxx11::stringbuf::str();
  Logger::error(pLVar8,(char *)local_11b8._0_8_);
  if ((undefined1 *)local_11b8._0_8_ != local_11b8 + 0x10) {
    operator_delete((void *)local_11b8._0_8_,local_11b8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1038);
  std::ios_base::~ios_base((ios_base *)(local_1038 + 0x70));
LAB_00488cd6:
  if ((byte *)local_11f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_11f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_11f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_11f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*stream->_vptr_IOStream[1])(stream);
  return;
}

Assistant:

void NFFImporter::LoadNFF2MaterialTable(std::vector<ShadingInfo>& output,
    const std::string& path, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( path, "rb"));

    // Check whether we can read from the file
    if( !file.get())    {
        ASSIMP_LOG_ERROR("NFF2: Unable to open material library " + path + ".");
        return;
    }

    // get the size of the file
    const unsigned int m = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2(m+1);
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // First of all: remove all comments from the file
    CommentRemover::RemoveLineComments("//",&mBuffer2[0]);

    // The file should start with the magic sequence "mat"
    if (!TokenMatch(buffer,"mat",3))    {
        ASSIMP_LOG_ERROR_F("NFF2: Not a valid material library ", path, ".");
        return;
    }

    ShadingInfo* curShader = NULL;

    // No read the file line per line
    char line[4096];
    const char* sz;
    while (GetNextLine(buffer,line))
    {
        SkipSpaces(line,&sz);

        // 'version' defines the version of the file format
        if (TokenMatch(sz,"version",7))
        {
            ASSIMP_LOG_INFO_F("NFF (Sense8) material library file format: ", std::string(sz));
        }
        // 'matdef' starts a new material in the file
        else if (TokenMatch(sz,"matdef",6))
        {
            // add a new material to the list
            output.push_back( ShadingInfo() );
            curShader = & output.back();

            // parse the name of the material
        }
        else if (!TokenMatch(sz,"valid",5))
        {
            // check whether we have an active material at the moment
            if (!IsLineEnd(*sz))
            {
                if (!curShader)
                {
                    ASSIMP_LOG_ERROR_F("NFF2 material library: Found element ", sz, "but there is no active material");
                    continue;
                }
            }
            else continue;

            // now read the material property and determine its type
            aiColor3D c;
            if (TokenMatch(sz,"ambient",7))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->ambient = c;
            }
            else if (TokenMatch(sz,"diffuse",7) || TokenMatch(sz,"ambientdiffuse",14) /* correct? */)
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->diffuse = curShader->ambient = c;
            }
            else if (TokenMatch(sz,"specular",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->specular = c;
            }
            else if (TokenMatch(sz,"emission",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->emissive = c;
            }
            else if (TokenMatch(sz,"shininess",9))
            {
                AI_NFF_PARSE_FLOAT(curShader->shininess);
            }
            else if (TokenMatch(sz,"opacity",7))
            {
                AI_NFF_PARSE_FLOAT(curShader->opacity);
            }
        }
    }
}